

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
          (QMovableArrayOps<QCss::StyleSheet> *this,qsizetype i,StyleSheet *args)

{
  StyleSheet **ppSVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_f8;
  StyleSheet tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::StyleSheet>).
           super_QArrayDataPointer<QCss::StyleSheet>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCss::StyleSheet>).super_QArrayDataPointer<QCss::StyleSheet>.
        size == i) {
      qVar5 = QArrayDataPointer<QCss::StyleSheet>::freeSpaceAtEnd
                        ((QArrayDataPointer<QCss::StyleSheet> *)this);
      if (qVar5 == 0) goto LAB_0035d268;
      QCss::StyleSheet::StyleSheet
                ((this->super_QGenericArrayOps<QCss::StyleSheet>).
                 super_QArrayDataPointer<QCss::StyleSheet>.ptr +
                 (this->super_QGenericArrayOps<QCss::StyleSheet>).
                 super_QArrayDataPointer<QCss::StyleSheet>.size,args);
LAB_0035d36d:
      pqVar2 = &(this->super_QGenericArrayOps<QCss::StyleSheet>).
                super_QArrayDataPointer<QCss::StyleSheet>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0035d31f;
    }
LAB_0035d268:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QCss::StyleSheet>::freeSpaceAtBegin
                        ((QArrayDataPointer<QCss::StyleSheet> *)this);
      if (qVar5 != 0) {
        QCss::StyleSheet::StyleSheet
                  ((this->super_QGenericArrayOps<QCss::StyleSheet>).
                   super_QArrayDataPointer<QCss::StyleSheet>.ptr + -1,args);
        ppSVar1 = &(this->super_QGenericArrayOps<QCss::StyleSheet>).
                   super_QArrayDataPointer<QCss::StyleSheet>.ptr;
        *ppSVar1 = *ppSVar1 + -1;
        goto LAB_0035d36d;
      }
    }
  }
  memset(&tmp,0xaa,0xa0);
  QCss::StyleSheet::StyleSheet(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QCss::StyleSheet>).super_QArrayDataPointer<QCss::StyleSheet>
          .size != 0;
  QArrayDataPointer<QCss::StyleSheet>::detachAndGrow
            ((QArrayDataPointer<QCss::StyleSheet> *)this,(uint)(i == 0 && bVar6),1,
             (StyleSheet **)0x0,(QArrayDataPointer<QCss::StyleSheet> *)0x0);
  if (i == 0 && bVar6) {
    QCss::StyleSheet::StyleSheet
              ((this->super_QGenericArrayOps<QCss::StyleSheet>).
               super_QArrayDataPointer<QCss::StyleSheet>.ptr + -1,&tmp);
    ppSVar1 = &(this->super_QGenericArrayOps<QCss::StyleSheet>).
               super_QArrayDataPointer<QCss::StyleSheet>.ptr;
    *ppSVar1 = *ppSVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::StyleSheet>).
              super_QArrayDataPointer<QCss::StyleSheet>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_f8,(QArrayDataPointer<QCss::StyleSheet> *)this,i,1);
    QCss::StyleSheet::StyleSheet(local_f8.displaceFrom,&tmp);
    local_f8.displaceFrom = local_f8.displaceFrom + 1;
    (local_f8.data)->size = (local_f8.data)->size + local_f8.nInserts;
  }
  QCss::StyleSheet::~StyleSheet(&tmp);
LAB_0035d31f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }